

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextColoredV(ImVec4 *col,char *fmt,__va_list_tag *args)

{
  uint uVar1;
  void *pvVar2;
  __va_list_tag *in_RDX;
  char *in_RSI;
  ImGuiTextFlags in_stack_000000f4;
  char *in_stack_000000f8;
  char *in_stack_00000100;
  undefined8 in_stack_ffffffffffffffd0;
  int count;
  
  count = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  PushStyleColor((ImGuiCol)((ulong)in_RSI >> 0x20),(ImVec4 *)in_RDX);
  if (((*in_RSI == '%') && (in_RSI[1] == 's')) && (in_RSI[2] == '\0')) {
    uVar1 = in_RDX->gp_offset;
    if (uVar1 < 0x29) {
      pvVar2 = (void *)((long)(int)uVar1 + (long)in_RDX->reg_save_area);
      in_RDX->gp_offset = uVar1 + 8;
    }
    else {
      pvVar2 = in_RDX->overflow_arg_area;
      in_RDX->overflow_arg_area = (void *)((long)pvVar2 + 8);
    }
    count = (int)((ulong)pvVar2 >> 0x20);
    TextEx(in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
  }
  else {
    TextV(in_RSI,in_RDX);
  }
  PopStyleColor(count);
  return;
}

Assistant:

void ImGui::TextColoredV(const ImVec4& col, const char* fmt, va_list args)
{
    PushStyleColor(ImGuiCol_Text, col);
    if (fmt[0] == '%' && fmt[1] == 's' && fmt[2] == 0)
        TextEx(va_arg(args, const char*), NULL, ImGuiTextFlags_NoWidthForLargeClippedText); // Skip formatting
    else
        TextV(fmt, args);
    PopStyleColor();
}